

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O0

void __thiscall Ui_InitGameDialog::retranslateUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  QLabel *pQVar1;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_30;
  QDialog *local_18;
  QDialog *InitGameDialog_local;
  Ui_InitGameDialog *this_local;
  
  local_18 = InitGameDialog;
  InitGameDialog_local = (QDialog *)this;
  QCoreApplication::translate((char *)&local_30,"InitGameDialog","Dialog",0);
  QWidget::setWindowTitle((QString *)InitGameDialog);
  QString::~QString(&local_30);
  pQVar1 = this->player1Label;
  QCoreApplication::translate((char *)&local_58,"InitGameDialog","Player1:",0);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_58);
  pQVar1 = this->player2Label;
  QCoreApplication::translate((char *)&local_70,"InitGameDialog","Player2:",0);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_70);
  pQVar1 = this->label;
  QCoreApplication::translate((char *)&local_88,"InitGameDialog","Grid size:",0);
  QLabel::setText((QString *)pQVar1);
  QString::~QString(&local_88);
  return;
}

Assistant:

void retranslateUi(QDialog *InitGameDialog)
    {
        InitGameDialog->setWindowTitle(QCoreApplication::translate("InitGameDialog", "Dialog", nullptr));
        player1Label->setText(QCoreApplication::translate("InitGameDialog", "Player1:", nullptr));
        player2Label->setText(QCoreApplication::translate("InitGameDialog", "Player2:", nullptr));
        label->setText(QCoreApplication::translate("InitGameDialog", "Grid size:", nullptr));
    }